

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bm_utils.c
# Opt level: O0

long julian(long date)

{
  long lVar1;
  long yend;
  long yr;
  long result;
  long offset;
  long date_local;
  
  offset = date + -0x16761;
  result = 0x16761;
  while( true ) {
    lVar1 = result / 1000;
    lVar1 = lVar1 * 1000 + 0x16d + (long)(int)(uint)(lVar1 % 4 == 0 && lVar1 % 100 != 0);
    if (result + offset <= lVar1) break;
    offset = offset - ((lVar1 - result) + 1);
    result = result + 1000;
  }
  return result + offset;
}

Assistant:

long
julian(long date)
{
    long       offset;
    long      result;
    long      yr;
    long      yend;

    offset = date - STARTDATE;
    result = STARTDATE;

#ifdef _MSC_VER
/* Disable warning about conditional expression is constant */ 
#pragma warning(disable:4127)
#endif 

    while (1)
        {
#ifdef _MSC_VER
#pragma warning(default:4127)
#endif 
        yr = result / 1000;
        yend = yr * 1000 + 365 + LEAP(yr);
        if (result + offset > yend)   /* overflow into next year */
            {
            offset -= yend - result + 1;
            result += 1000;
            continue;
            }
        else
            break;
        }
    return (result + offset);
}